

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

void fly(ProgressData *bar,_Bool moved)

{
  int iVar1;
  int iVar2;
  int local_134;
  int check;
  int pos;
  char buf [256];
  _Bool moved_local;
  ProgressData *bar_local;
  
  iVar2 = bar->width + -2;
  buf[0xff] = moved;
  curl_msnprintf(&check,0x100,"%*s\r",bar->width + -1," ");
  iVar1 = bar->bar;
  *(undefined4 *)((long)&check + (long)iVar1) = 0x3d4f3d2d;
  buf[(long)iVar1 + -4] = '-';
  *(undefined1 *)
   ((long)&check +
   (long)(int)((ulong)sinus[(ulong)bar->tick % 200] / (10000 / (long)iVar2 & 0xffffffffU))) = 0x23;
  *(undefined1 *)
   ((long)&check +
   (long)(int)((ulong)sinus[(ulong)(bar->tick + 5) % 200] / (10000 / (long)iVar2 & 0xffffffffU))) =
       0x23;
  *(undefined1 *)
   ((long)&check +
   (long)(int)((ulong)sinus[(ulong)(bar->tick + 10) % 200] / (10000 / (long)iVar2 & 0xffffffffU))) =
       0x23;
  *(undefined1 *)
   ((long)&check +
   (long)(int)((ulong)sinus[(ulong)(bar->tick + 0xf) % 200] / (10000 / (long)iVar2 & 0xffffffffU)))
       = 0x23;
  fputs((char *)&check,(FILE *)bar->out);
  bar->tick = bar->tick + 2;
  if (199 < bar->tick) {
    bar->tick = bar->tick - 200;
  }
  if ((buf[0xff] & 1U) == 0) {
    local_134 = 0;
  }
  else {
    local_134 = bar->barmove;
  }
  bar->bar = local_134 + bar->bar;
  if (bar->bar < bar->width + -6) {
    if (bar->bar < 0) {
      bar->barmove = 1;
      bar->bar = 0;
    }
  }
  else {
    bar->barmove = -1;
    bar->bar = bar->width + -6;
  }
  return;
}

Assistant:

static void fly(struct ProgressData *bar, bool moved)
{
  char buf[256];
  int pos;
  int check = bar->width - 2;

  msnprintf(buf, sizeof(buf), "%*s\r", bar->width-1, " ");
  memcpy(&buf[bar->bar], "-=O=-", 5);

  pos = sinus[bar->tick%200] / (10000 / check);
  buf[pos] = '#';
  pos = sinus[(bar->tick + 5)%200] / (10000 / check);
  buf[pos] = '#';
  pos = sinus[(bar->tick + 10)%200] / (10000 / check);
  buf[pos] = '#';
  pos = sinus[(bar->tick + 15)%200] / (10000 / check);
  buf[pos] = '#';

  fputs(buf, bar->out);
  bar->tick += 2;
  if(bar->tick >= 200)
    bar->tick -= 200;

  bar->bar += (moved?bar->barmove:0);
  if(bar->bar >= (bar->width - 6)) {
    bar->barmove = -1;
    bar->bar = bar->width - 6;
  }
  else if(bar->bar < 0) {
    bar->barmove = 1;
    bar->bar = 0;
  }
}